

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaccessiblewidgetfactory.cpp
# Opt level: O3

QAccessibleInterface * qAccessibleFactory(QString *classname,QObject *object)

{
  long lVar1;
  char16_t *pcVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  char cVar14;
  QAccessibleAbstractSpinBox *this;
  undefined *puVar15;
  QAccessibleTable *this_00;
  Role RVar16;
  long in_FS_OFFSET;
  QStringView QVar17;
  QStringView QVar18;
  QStringView QVar19;
  QStringView QVar20;
  QStringView QVar21;
  QStringView QVar22;
  QStringView QVar23;
  QStringView QVar24;
  QStringView QVar25;
  QStringView QVar26;
  QStringView QVar27;
  QStringView QVar28;
  QStringView QVar29;
  QStringView QVar30;
  QStringView QVar31;
  QStringView QVar32;
  QStringView QVar33;
  QStringView QVar34;
  QStringView QVar35;
  QStringView QVar36;
  QStringView QVar37;
  QStringView QVar38;
  QStringView QVar39;
  QStringView QVar40;
  QStringView QVar41;
  QStringView QVar42;
  QStringView QVar43;
  QStringView QVar44;
  QStringView QVar45;
  QStringView QVar46;
  QStringView QVar47;
  QStringView QVar48;
  QStringView QVar49;
  QStringView QVar50;
  QStringView QVar51;
  QStringView QVar52;
  QStringView QVar53;
  QStringView QVar54;
  QStringView QVar55;
  QStringView QVar56;
  QStringView QVar57;
  QStringView QVar58;
  QStringView QVar59;
  QStringView QVar60;
  QStringView QVar61;
  QStringView QVar62;
  QStringView QVar63;
  QStringView QVar64;
  QStringView QVar65;
  QStringView QVar66;
  QLatin1String QVar67;
  QLatin1String QVar68;
  QLatin1String QVar69;
  QLatin1String QVar70;
  QLatin1String QVar71;
  QLatin1String QVar72;
  QLatin1String QVar73;
  QLatin1String QVar74;
  QLatin1String QVar75;
  QLatin1String QVar76;
  QLatin1String QVar77;
  QLatin1String QVar78;
  QLatin1String QVar79;
  QLatin1String QVar80;
  QLatin1String QVar81;
  QLatin1String QVar82;
  QLatin1String QVar83;
  QLatin1String QVar84;
  QLatin1String QVar85;
  QLatin1String QVar86;
  QLatin1String QVar87;
  QLatin1String QVar88;
  QLatin1String QVar89;
  QLatin1String QVar90;
  QLatin1String QVar91;
  QLatin1String QVar92;
  QLatin1String QVar93;
  QLatin1String QVar94;
  QLatin1String QVar95;
  QLatin1String QVar96;
  QLatin1String QVar97;
  QLatin1String QVar98;
  QLatin1String QVar99;
  QLatin1String QVar100;
  QLatin1String QVar101;
  QLatin1String QVar102;
  QLatin1String QVar103;
  QLatin1String QVar104;
  QLatin1String QVar105;
  QLatin1String QVar106;
  QLatin1String QVar107;
  QLatin1String QVar108;
  QLatin1String QVar109;
  QLatin1String QVar110;
  QLatin1String QVar111;
  QLatin1String QVar112;
  QLatin1String QVar113;
  QLatin1String QVar114;
  QLatin1String QVar115;
  QLatin1String QVar116;
  QString local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (((object == (QObject *)0x0) || ((*(byte *)(*(long *)(object + 8) + 0x30) & 1) == 0)) ||
     ((*(byte *)(*(long *)(object + 8) + 0x1c2) & 4) != 0)) goto LAB_0051b857;
  lVar1 = (classname->d).size;
  if (lVar1 == 9) {
    pcVar2 = (classname->d).ptr;
    QVar17.m_data = pcVar2;
    QVar17.m_size = 9;
    QVar67.m_data = "QLineEdit";
    QVar67.m_size = 9;
    cVar14 = QtPrivate::equalStrings(QVar17,QVar67);
    if (cVar14 == '\0') {
      QVar21.m_data = pcVar2;
      QVar21.m_size = 9;
      QVar71.m_data = "QComboBox";
      QVar71.m_size = 9;
      cVar14 = QtPrivate::equalStrings(QVar21,QVar71);
      if (cVar14 != '\0') {
        this = (QAccessibleAbstractSpinBox *)operator_new(0x20);
        QAccessibleComboBox::QAccessibleComboBox((QAccessibleComboBox *)this,(QWidget *)object);
        goto LAB_0051b85a;
      }
      QVar22.m_data = (classname->d).ptr;
      QVar22.m_size = 9;
      QVar72.m_data = "QCheckBox";
      QVar72.m_size = 9;
      cVar14 = QtPrivate::equalStrings(QVar22,QVar72);
      if (cVar14 == '\0') {
        bVar3 = false;
        goto LAB_0051b8a5;
      }
      goto LAB_0051bedd;
    }
    QObject::objectName();
    if (local_58.d.size == 0x13) {
      QVar18.m_data = local_58.d.ptr;
      QVar18.m_size = 0x13;
      QVar68.m_data = "qt_spinbox_lineedit";
      QVar68.m_size = 0x13;
      cVar14 = QtPrivate::equalStrings(QVar18,QVar68);
    }
    else {
      cVar14 = '\0';
    }
    if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (cVar14 != '\0') goto LAB_0051b857;
    this = (QAccessibleAbstractSpinBox *)operator_new(0x30);
    local_58.d.d = (Data *)0x0;
    local_58.d.ptr = (storage_type_conflict *)0x0;
    local_58.d.size = 0;
    QAccessibleLineEdit::QAccessibleLineEdit
              ((QAccessibleLineEdit *)this,(QWidget *)object,&local_58);
    goto LAB_0051c1c3;
  }
  bVar4 = false;
  bVar6 = false;
  bVar10 = false;
  bVar9 = false;
  bVar3 = false;
  bVar7 = false;
  bVar8 = false;
  bVar5 = false;
  bVar11 = false;
  bVar12 = false;
  bVar13 = false;
  switch(lVar1) {
  case 5:
switchD_0051b78a_caseD_5:
    bVar9 = bVar13;
    bVar8 = bVar12;
    bVar6 = bVar11;
    QVar47.m_data = (classname->d).ptr;
    QVar47.m_size = 5;
    QVar97.m_data = "QMenu";
    QVar97.m_size = 5;
    cVar14 = QtPrivate::equalStrings(QVar47,QVar97);
    bVar5 = true;
    if (cVar14 != '\0') {
      this = (QAccessibleAbstractSpinBox *)operator_new(0x20);
      QAccessibleMenu::QAccessibleMenu((QAccessibleMenu *)this,(QWidget *)object);
      goto LAB_0051b85a;
    }
LAB_0051c05d:
    if ((bVar3) &&
       (QVar50.m_data = (classname->d).ptr, QVar50.m_size = 10, QVar100.m_data = "QTableView",
       QVar100.m_size = 10, cVar14 = QtPrivate::equalStrings(QVar50,QVar100), cVar14 != '\0')) {
      this_00 = (QAccessibleTable *)operator_new(0x30);
      QAccessibleTable::QAccessibleTable(this_00,(QWidget *)object);
      goto LAB_0051c3af;
    }
    if ((bVar10) &&
       (QVar51.m_data = (classname->d).ptr, QVar51.m_size = 7, QVar101.m_data = "QTabBar",
       QVar101.m_size = 7, cVar14 = QtPrivate::equalStrings(QVar51,QVar101), cVar14 != '\0')) {
      this = (QAccessibleAbstractSpinBox *)operator_new(0x30);
      QAccessibleTabBar::QAccessibleTabBar((QAccessibleTabBar *)this,(QWidget *)object);
      goto LAB_0051b85a;
    }
    if (lVar1 == 9) {
      pcVar2 = (classname->d).ptr;
      QVar52.m_data = pcVar2;
      QVar52.m_size = 9;
      QVar102.m_data = "QSizeGrip";
      QVar102.m_size = 9;
      cVar14 = QtPrivate::equalStrings(QVar52,QVar102);
      if (cVar14 == '\0') {
        QVar53.m_data = pcVar2;
        QVar53.m_size = 9;
        QVar103.m_data = "QSplitter";
        QVar103.m_size = 9;
        cVar14 = QtPrivate::equalStrings(QVar53,QVar103);
        if (cVar14 != '\0') {
          this = (QAccessibleAbstractSpinBox *)operator_new(0x20);
          local_58.d.d = (Data *)0x0;
          local_58.d.ptr = (storage_type_conflict *)0x0;
          local_58.d.size = 0;
          RVar16 = Splitter;
          break;
        }
        goto LAB_0051c165;
      }
    }
    else {
LAB_0051c165:
      if ((!bVar9) ||
         (QVar54.m_data = (classname->d).ptr, QVar54.m_size = 0xf,
         QVar104.m_data = "QSplitterHandle", QVar104.m_size = 0xf,
         cVar14 = QtPrivate::equalStrings(QVar54,QVar104), cVar14 == '\0')) {
        if ((lVar1 == 9) &&
           (QVar55.m_data = (classname->d).ptr, QVar55.m_size = 9, QVar105.m_data = "QTextEdit",
           QVar105.m_size = 9, cVar14 = QtPrivate::equalStrings(QVar55,QVar105), cVar14 != '\0')) {
          this = (QAccessibleAbstractSpinBox *)operator_new(0x30);
          QAccessibleTextEdit::QAccessibleTextEdit((QAccessibleTextEdit *)this,(QWidget *)object);
          goto LAB_0051b85a;
        }
        bVar3 = false;
        goto LAB_0051c4c4;
      }
    }
    this = (QAccessibleAbstractSpinBox *)operator_new(0x20);
    local_58.d.d = (Data *)0x0;
    local_58.d.ptr = (storage_type_conflict *)0x0;
    local_58.d.size = 0;
    RVar16 = Grip;
    break;
  case 6:
    QVar19.m_data = (classname->d).ptr;
    QVar19.m_size = 6;
    QVar69.m_data = "QLabel";
    QVar69.m_size = 6;
    cVar14 = QtPrivate::equalStrings(QVar19,QVar69);
    if (cVar14 != '\0') goto LAB_0051bd17;
    QVar20.m_data = (classname->d).ptr;
    QVar20.m_size = 6;
    QVar70.m_data = "QFrame";
    QVar70.m_size = 6;
    cVar14 = QtPrivate::equalStrings(QVar20,QVar70);
    if (cVar14 == '\0') {
      bVar7 = false;
      bVar3 = false;
      bVar9 = false;
      bVar10 = false;
      bVar6 = false;
      bVar8 = false;
      bVar5 = false;
      goto LAB_0051c521;
    }
    goto LAB_0051be4b;
  case 7:
    pcVar2 = (classname->d).ptr;
    QVar26.m_data = pcVar2;
    QVar26.m_size = 7;
    QVar76.m_data = "QSlider";
    QVar76.m_size = 7;
    cVar14 = QtPrivate::equalStrings(QVar26,QVar76);
    if (cVar14 != '\0') {
      this = (QAccessibleAbstractSpinBox *)operator_new(0x28);
      QAccessibleSlider::QAccessibleSlider((QAccessibleSlider *)this,(QWidget *)object);
      goto LAB_0051b85a;
    }
    QVar34.m_data = pcVar2;
    QVar34.m_size = 7;
    QVar84.m_data = "QDialog";
    QVar84.m_size = 7;
    cVar14 = QtPrivate::equalStrings(QVar34,QVar84);
    if (cVar14 == '\0') {
      bVar10 = true;
      bVar3 = false;
      bVar9 = false;
LAB_0051b8b0:
      bVar6 = false;
LAB_0051b8b8:
      bVar4 = false;
      goto LAB_0051b8ba;
    }
    this = (QAccessibleAbstractSpinBox *)operator_new(0x20);
    local_58.d.d = (Data *)0x0;
    local_58.d.ptr = (storage_type_conflict *)0x0;
    local_58.d.size = 0;
    RVar16 = Dialog;
    break;
  case 8:
    QVar30.m_data = (classname->d).ptr;
    QVar30.m_size = 8;
    QVar80.m_data = "QSpinBox";
    QVar80.m_size = 8;
    cVar14 = QtPrivate::equalStrings(QVar30,QVar80);
    if (cVar14 != '\0') {
      this = (QAccessibleAbstractSpinBox *)operator_new(0x40);
      QAccessibleSpinBox::QAccessibleSpinBox((QAccessibleSpinBox *)this,(QWidget *)object);
      goto LAB_0051b85a;
    }
    pcVar2 = (classname->d).ptr;
    QVar38.m_data = pcVar2;
    QVar38.m_size = 8;
    QVar88.m_data = "QToolBar";
    QVar88.m_size = 8;
    cVar14 = QtPrivate::equalStrings(QVar38,QVar88);
    if (cVar14 != '\0') {
      this = (QAccessibleAbstractSpinBox *)operator_new(0x20);
      QWidget::windowTitle(&local_58,(QWidget *)object);
      RVar16 = ToolBar;
      break;
    }
    QVar56.m_data = pcVar2;
    QVar56.m_size = 8;
    QVar106.m_data = "QMenuBar";
    QVar106.m_size = 8;
    cVar14 = QtPrivate::equalStrings(QVar56,QVar106);
    if (cVar14 != '\0') {
      this = (QAccessibleAbstractSpinBox *)operator_new(0x20);
      QAccessibleMenuBar::QAccessibleMenuBar((QAccessibleMenuBar *)this,(QWidget *)object);
      goto LAB_0051b85a;
    }
    bVar7 = true;
    bVar3 = false;
    bVar9 = false;
    bVar10 = false;
    bVar6 = false;
LAB_0051bba8:
    bVar8 = false;
LAB_0051bf49:
    bVar11 = bVar6;
    bVar12 = bVar8;
    bVar13 = bVar9;
    if (lVar1 == 5) goto switchD_0051b78a_caseD_5;
    if (lVar1 != 9) {
      bVar5 = false;
      goto LAB_0051c05d;
    }
    pcVar2 = (classname->d).ptr;
    QVar48.m_data = pcVar2;
    QVar48.m_size = 9;
    QVar98.m_data = "QTreeView";
    QVar98.m_size = 9;
    cVar14 = QtPrivate::equalStrings(QVar48,QVar98);
    if (cVar14 == '\0') {
      QVar59.m_data = pcVar2;
      QVar59.m_size = 9;
      QVar109.m_data = "QListView";
      QVar109.m_size = 9;
      cVar14 = QtPrivate::equalStrings(QVar59,QVar109);
      if (cVar14 == '\0') {
        bVar5 = false;
        goto LAB_0051c05d;
      }
      this_00 = (QAccessibleTable *)operator_new(0x30);
      QAccessibleTable::QAccessibleTable(this_00,(QWidget *)object);
      puVar15 = &QAccessibleList::vtable;
    }
    else {
      this_00 = (QAccessibleTable *)operator_new(0x30);
      QAccessibleTable::QAccessibleTable(this_00,(QWidget *)object);
      puVar15 = &QAccessibleTree::vtable;
    }
    *(undefined **)this_00 = puVar15 + 0x10;
    *(undefined **)&this_00->super_QAccessibleSelectionInterface = puVar15 + 0x168;
    *(undefined **)&this_00->super_QAccessibleObject = puVar15 + 0x1c8;
LAB_0051c3af:
    this = (QAccessibleAbstractSpinBox *)&this_00->super_QAccessibleObject;
    goto LAB_0051b85a;
  case 9:
  case 0xd:
    goto switchD_0051b78a_caseD_9;
  case 10:
    QVar31.m_data = (classname->d).ptr;
    QVar31.m_size = 10;
    QVar81.m_data = "QScrollBar";
    QVar81.m_size = 10;
    cVar14 = QtPrivate::equalStrings(QVar31,QVar81);
    if (cVar14 != '\0') {
      this = (QAccessibleAbstractSpinBox *)operator_new(0x28);
      QAccessibleScrollBar::QAccessibleScrollBar((QAccessibleScrollBar *)this,(QWidget *)object);
      goto LAB_0051b85a;
    }
    QVar39.m_data = (classname->d).ptr;
    QVar39.m_size = 10;
    QVar89.m_data = "QLCDNumber";
    QVar89.m_size = 10;
    cVar14 = QtPrivate::equalStrings(QVar39,QVar89);
    if (cVar14 == '\0') {
      bVar3 = true;
LAB_0051b8a5:
      bVar9 = false;
LAB_0051b8ad:
      bVar10 = false;
      goto LAB_0051b8b0;
    }
    goto LAB_0051bd17;
  case 0xb:
    pcVar2 = (classname->d).ptr;
    QVar27.m_data = pcVar2;
    QVar27.m_size = 0xb;
    QVar77.m_data = "QToolButton";
    QVar77.m_size = 0xb;
    cVar14 = QtPrivate::equalStrings(QVar27,QVar77);
    if (cVar14 != '\0') {
      this = (QAccessibleAbstractSpinBox *)operator_new(0x20);
      QAccessibleToolButton::QAccessibleToolButton((QAccessibleToolButton *)this,(QWidget *)object);
      goto LAB_0051b85a;
    }
    QVar35.m_data = pcVar2;
    QVar35.m_size = 0xb;
    QVar85.m_data = "QPushButton";
    QVar85.m_size = 0xb;
    cVar14 = QtPrivate::equalStrings(QVar35,QVar85);
    if (cVar14 == '\0') {
      pcVar2 = (classname->d).ptr;
      QVar36.m_data = pcVar2;
      QVar36.m_size = 0xb;
      QVar86.m_data = "QMessageBox";
      QVar86.m_size = 0xb;
      cVar14 = QtPrivate::equalStrings(QVar36,QVar86);
      if (cVar14 != '\0') {
        this = (QAccessibleAbstractSpinBox *)operator_new(0x20);
        QAccessibleMessageBox::QAccessibleMessageBox
                  ((QAccessibleMessageBox *)this,(QWidget *)object);
        goto LAB_0051b85a;
      }
      QVar61.m_data = pcVar2;
      QVar61.m_size = 0xb;
      QVar111.m_data = "QMainWindow";
      QVar111.m_size = 0xb;
      cVar14 = QtPrivate::equalStrings(QVar61,QVar111);
      if (cVar14 != '\0') {
        this = (QAccessibleAbstractSpinBox *)operator_new(0x20);
        QAccessibleMainWindow::QAccessibleMainWindow
                  ((QAccessibleMainWindow *)this,(QWidget *)object);
        goto LAB_0051b85a;
      }
      bVar6 = true;
      bVar3 = false;
      bVar9 = false;
      bVar10 = false;
      goto LAB_0051b8b8;
    }
    goto LAB_0051bedd;
  case 0xc:
    QVar28.m_data = (classname->d).ptr;
    QVar28.m_size = 0xc;
    QVar78.m_data = "QRadioButton";
    QVar78.m_size = 0xc;
    cVar14 = QtPrivate::equalStrings(QVar28,QVar78);
    if (cVar14 != '\0') goto LAB_0051bedd;
    bVar4 = true;
    bVar3 = false;
    bVar9 = false;
    bVar10 = false;
    bVar6 = false;
LAB_0051b8ba:
    if ((lVar1 == 9) &&
       (QVar23.m_data = (classname->d).ptr, QVar23.m_size = 9, QVar73.m_data = "QGroupBox",
       QVar73.m_size = 9, cVar14 = QtPrivate::equalStrings(QVar23,QVar73), cVar14 != '\0')) {
      this = (QAccessibleAbstractSpinBox *)operator_new(0x20);
      QAccessibleGroupBox::QAccessibleGroupBox((QAccessibleGroupBox *)this,(QWidget *)object);
      goto LAB_0051b85a;
    }
    if ((!bVar3) ||
       (QVar24.m_data = (classname->d).ptr, QVar24.m_size = 10, QVar74.m_data = "QStatusBar",
       QVar74.m_size = 10, cVar14 = QtPrivate::equalStrings(QVar24,QVar74), cVar14 == '\0')) {
      if (!bVar4) {
        bVar7 = false;
        goto LAB_0051bba8;
      }
      QVar25.m_data = (classname->d).ptr;
      QVar25.m_size = 0xc;
      QVar75.m_data = "QProgressBar";
      QVar75.m_size = 0xc;
      cVar14 = QtPrivate::equalStrings(QVar25,QVar75);
      if (cVar14 != '\0') {
        this = (QAccessibleAbstractSpinBox *)operator_new(0x30);
        QAccessibleProgressBar::QAccessibleProgressBar
                  ((QAccessibleProgressBar *)this,(QWidget *)object);
        goto LAB_0051b85a;
      }
      bVar8 = true;
      bVar7 = false;
      goto LAB_0051bf49;
    }
LAB_0051bd17:
    this = (QAccessibleAbstractSpinBox *)operator_new(0x28);
    RVar16 = StaticText;
LAB_0051bd2f:
    QAccessibleDisplay::QAccessibleDisplay((QAccessibleDisplay *)this,(QWidget *)object,RVar16);
    goto LAB_0051b85a;
  case 0xe:
    QVar29.m_data = (classname->d).ptr;
    QVar29.m_size = 0xe;
    QVar79.m_data = "QDoubleSpinBox";
    QVar79.m_size = 0xe;
    cVar14 = QtPrivate::equalStrings(QVar29,QVar79);
    if (cVar14 != '\0') {
      this = (QAccessibleAbstractSpinBox *)operator_new(0x40);
      QAccessibleDoubleSpinBox::QAccessibleDoubleSpinBox
                ((QAccessibleDoubleSpinBox *)this,(QWidget *)object);
      goto LAB_0051b85a;
    }
    QVar37.m_data = (classname->d).ptr;
    QVar37.m_size = 0xe;
    QVar87.m_data = "QPlainTextEdit";
    QVar87.m_size = 0xe;
    cVar14 = QtPrivate::equalStrings(QVar37,QVar87);
    if (cVar14 != '\0') {
      this = (QAccessibleAbstractSpinBox *)operator_new(0x30);
      QAccessiblePlainTextEdit::QAccessiblePlainTextEdit
                ((QAccessiblePlainTextEdit *)this,(QWidget *)object);
      goto LAB_0051b85a;
    }
    bVar3 = true;
    bVar5 = false;
    bVar8 = false;
    bVar6 = false;
    bVar10 = false;
    bVar9 = false;
    bVar7 = false;
LAB_0051c4c4:
    if ((lVar1 != 9) ||
       (QVar63.m_data = (classname->d).ptr, QVar63.m_size = 9, QVar113.m_data = "QTipLabel",
       QVar113.m_size = 9, cVar14 = QtPrivate::equalStrings(QVar63,QVar113), cVar14 == '\0')) {
LAB_0051c521:
      if ((bVar3) &&
         (QVar64.m_data = (classname->d).ptr, QVar64.m_size = 0xe, QVar114.m_data = "QStackedWidget"
         , QVar114.m_size = 0xe, cVar14 = QtPrivate::equalStrings(QVar64,QVar114), cVar14 != '\0'))
      {
        this = (QAccessibleAbstractSpinBox *)operator_new(0x20);
        QAccessibleStackedWidget::QAccessibleStackedWidget
                  ((QAccessibleStackedWidget *)this,(QWidget *)object);
        goto LAB_0051b85a;
      }
      if (bVar7) {
        pcVar2 = (classname->d).ptr;
        QVar65.m_data = pcVar2;
        QVar65.m_size = 8;
        QVar115.m_data = "QToolBox";
        QVar115.m_size = 8;
        cVar14 = QtPrivate::equalStrings(QVar65,QVar115);
        if (cVar14 != '\0') {
          this = (QAccessibleAbstractSpinBox *)operator_new(0x20);
          QAccessibleToolBox::QAccessibleToolBox((QAccessibleToolBox *)this,(QWidget *)object);
          goto LAB_0051b85a;
        }
        QVar66.m_data = pcVar2;
        QVar66.m_size = 8;
        QVar116.m_data = "QMdiArea";
        QVar116.m_size = 8;
        cVar14 = QtPrivate::equalStrings(QVar66,QVar116);
        if (cVar14 != '\0') {
          this = (QAccessibleAbstractSpinBox *)operator_new(0x20);
          QAccessibleMdiArea::QAccessibleMdiArea((QAccessibleMdiArea *)this,(QWidget *)object);
          goto LAB_0051b85a;
        }
        bVar4 = false;
      }
      else {
        bVar4 = false;
      }
      goto switchD_0051b78a_caseD_9;
    }
    this = (QAccessibleAbstractSpinBox *)operator_new(0x28);
    RVar16 = ToolTip;
    goto LAB_0051bd2f;
  case 0xf:
    pcVar2 = (classname->d).ptr;
    QVar33.m_data = pcVar2;
    QVar33.m_size = 0xf;
    QVar83.m_data = "QAbstractSlider";
    QVar83.m_size = 0xf;
    cVar14 = QtPrivate::equalStrings(QVar33,QVar83);
    if (cVar14 != '\0') {
      this = (QAccessibleAbstractSpinBox *)operator_new(0x28);
      QAccessibleAbstractSlider::QAccessibleAbstractSlider
                ((QAccessibleAbstractSlider *)this,(QWidget *)object,Slider);
      goto LAB_0051b85a;
    }
    QVar45.m_data = pcVar2;
    QVar45.m_size = 0xf;
    QVar95.m_data = "QAbstractButton";
    QVar95.m_size = 0xf;
    cVar14 = QtPrivate::equalStrings(QVar45,QVar95);
    if (cVar14 == '\0') {
      bVar9 = true;
      bVar3 = false;
      goto LAB_0051b8ad;
    }
LAB_0051bedd:
    this = (QAccessibleAbstractSpinBox *)operator_new(0x20);
    QAccessibleButton::QAccessibleButton((QAccessibleButton *)this,(QWidget *)object);
    goto LAB_0051b85a;
  case 0x10:
    QVar32.m_data = (classname->d).ptr;
    QVar32.m_size = 0x10;
    QVar82.m_data = "QAbstractSpinBox";
    QVar82.m_size = 0x10;
    cVar14 = QtPrivate::equalStrings(QVar32,QVar82);
    if (cVar14 != '\0') {
      this = (QAccessibleAbstractSpinBox *)operator_new(0x40);
      QAccessibleAbstractSpinBox::QAccessibleAbstractSpinBox(this,(QWidget *)object);
      goto LAB_0051b85a;
    }
    bVar4 = true;
  default:
    bVar9 = false;
    bVar10 = false;
    bVar6 = false;
    bVar8 = false;
    bVar5 = false;
switchD_0051b78a_caseD_9:
    if ((lVar1 == 0xd) &&
       (QVar40.m_data = (classname->d).ptr, QVar40.m_size = 0xd, QVar90.m_data = "QMdiSubWindow",
       QVar90.m_size = 0xd, cVar14 = QtPrivate::equalStrings(QVar40,QVar90), cVar14 != '\0')) {
      this = (QAccessibleAbstractSpinBox *)operator_new(0x20);
      QAccessibleMdiSubWindow::QAccessibleMdiSubWindow
                ((QAccessibleMdiSubWindow *)this,(QWidget *)object);
      goto LAB_0051b85a;
    }
    if ((bVar4) &&
       (QVar41.m_data = (classname->d).ptr, QVar41.m_size = 0x10, QVar91.m_data = "QDialogButtonBox"
       , QVar91.m_size = 0x10, cVar14 = QtPrivate::equalStrings(QVar41,QVar91), cVar14 != '\0')) {
      this = (QAccessibleAbstractSpinBox *)operator_new(0x20);
      QAccessibleDialogButtonBox::QAccessibleDialogButtonBox
                ((QAccessibleDialogButtonBox *)this,(QWidget *)object);
      goto LAB_0051b85a;
    }
    if ((bVar5) &&
       (QVar42.m_data = (classname->d).ptr, QVar42.m_size = 5, QVar92.m_data = "QDial",
       QVar92.m_size = 5, cVar14 = QtPrivate::equalStrings(QVar42,QVar92), cVar14 != '\0')) {
      this = (QAccessibleAbstractSpinBox *)operator_new(0x28);
      QAccessibleDial::QAccessibleDial((QAccessibleDial *)this,(QWidget *)object);
      goto LAB_0051b85a;
    }
    if ((bVar6) &&
       (QVar43.m_data = (classname->d).ptr, QVar43.m_size = 0xb, QVar93.m_data = "QRubberBand",
       QVar93.m_size = 0xb, cVar14 = QtPrivate::equalStrings(QVar43,QVar93), cVar14 != '\0')) {
LAB_0051be4b:
      this = (QAccessibleAbstractSpinBox *)operator_new(0x20);
      local_58.d.d = (Data *)0x0;
      local_58.d.ptr = (storage_type_conflict *)0x0;
      local_58.d.size = 0;
      RVar16 = Border;
    }
    else {
      if ((bVar8) &&
         (QVar44.m_data = (classname->d).ptr, QVar44.m_size = 0xc, QVar94.m_data = "QTextBrowser",
         QVar94.m_size = 0xc, cVar14 = QtPrivate::equalStrings(QVar44,QVar94), cVar14 != '\0')) {
        this = (QAccessibleAbstractSpinBox *)operator_new(0x30);
        QAccessibleTextBrowser::QAccessibleTextBrowser
                  ((QAccessibleTextBrowser *)this,(QWidget *)object);
        goto LAB_0051b85a;
      }
      if ((lVar1 == 0x13) &&
         (QVar46.m_data = (classname->d).ptr, QVar46.m_size = 0x13,
         QVar96.m_data = "QAbstractScrollArea", QVar96.m_size = 0x13,
         cVar14 = QtPrivate::equalStrings(QVar46,QVar96), cVar14 != '\0')) {
        this = (QAccessibleAbstractSpinBox *)operator_new(0x20);
        QAccessibleAbstractScrollArea::QAccessibleAbstractScrollArea
                  ((QAccessibleAbstractScrollArea *)this,(QWidget *)object);
        goto LAB_0051b85a;
      }
      if ((bVar6) &&
         (QVar49.m_data = (classname->d).ptr, QVar49.m_size = 0xb, QVar99.m_data = "QScrollArea",
         QVar99.m_size = 0xb, cVar14 = QtPrivate::equalStrings(QVar49,QVar99), cVar14 != '\0')) {
        this = (QAccessibleAbstractSpinBox *)operator_new(0x20);
        QAccessibleScrollArea::QAccessibleScrollArea
                  ((QAccessibleScrollArea *)this,(QWidget *)object);
        goto LAB_0051b85a;
      }
      if ((bVar9) &&
         (QVar57.m_data = (classname->d).ptr, QVar57.m_size = 0xf,
         QVar107.m_data = "QCalendarWidget", QVar107.m_size = 0xf,
         cVar14 = QtPrivate::equalStrings(QVar57,QVar107), cVar14 != '\0')) {
        this = (QAccessibleAbstractSpinBox *)operator_new(0x20);
        QAccessibleCalendarWidget::QAccessibleCalendarWidget
                  ((QAccessibleCalendarWidget *)this,(QWidget *)object);
        goto LAB_0051b85a;
      }
      if ((bVar6) &&
         (QVar58.m_data = (classname->d).ptr, QVar58.m_size = 0xb, QVar108.m_data = "QDockWidget",
         QVar108.m_size = 0xb, cVar14 = QtPrivate::equalStrings(QVar58,QVar108), cVar14 != '\0')) {
        this = (QAccessibleAbstractSpinBox *)operator_new(0x20);
        QAccessibleDockWidget::QAccessibleDockWidget
                  ((QAccessibleDockWidget *)this,(QWidget *)object);
        goto LAB_0051b85a;
      }
      if ((!bVar10) ||
         (QVar60.m_data = (classname->d).ptr, QVar60.m_size = 7, QVar110.m_data = "QWidget",
         QVar110.m_size = 7, cVar14 = QtPrivate::equalStrings(QVar60,QVar110), cVar14 == '\0')) {
        if ((bVar4) &&
           (QVar62.m_data = (classname->d).ptr, QVar62.m_size = 0x10,
           QVar112.m_data = "QWindowContainer", QVar112.m_size = 0x10,
           cVar14 = QtPrivate::equalStrings(QVar62,QVar112), cVar14 != '\0')) {
          this = (QAccessibleAbstractSpinBox *)operator_new(0x20);
          QAccessibleWindowContainer::QAccessibleWindowContainer
                    ((QAccessibleWindowContainer *)this,(QWidget *)object);
        }
        else {
LAB_0051b857:
          this = (QAccessibleAbstractSpinBox *)0x0;
        }
        goto LAB_0051b85a;
      }
      this = (QAccessibleAbstractSpinBox *)operator_new(0x20);
      local_58.d.d = (Data *)0x0;
      local_58.d.ptr = (storage_type_conflict *)0x0;
      local_58.d.size = 0;
      RVar16 = Client;
    }
  }
  QAccessibleWidget::QAccessibleWidget
            (&this->super_QAccessibleWidget,(QWidget *)object,RVar16,&local_58);
LAB_0051c1c3:
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
    }
  }
LAB_0051b85a:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (QAccessibleInterface *)this;
}

Assistant:

QAccessibleInterface *qAccessibleFactory(const QString &classname, QObject *object)
{
    QAccessibleInterface *iface = nullptr;
    if (!object || !object->isWidgetType())
        return iface;

    QWidget *widget = static_cast<QWidget*>(object);
    // QWidget emits destroyed() from its destructor instead of letting the QObject
    // destructor do it, which means the QWidget is unregistered from the accessibillity
    // cache. But QWidget destruction also emits enter and leave events, which may end
    // up here, so we have to ensure that we don't fill the cache with an entry of
    // a widget that is going away.
    if (QWidgetPrivate::get(widget)->data.in_destructor)
        return iface;

    if (false) {
#if QT_CONFIG(lineedit)
    } else if (classname == "QLineEdit"_L1) {
        if (widget->objectName() == "qt_spinbox_lineedit"_L1)
            iface = nullptr;
        else
            iface = new QAccessibleLineEdit(widget);
#endif
#if QT_CONFIG(combobox)
    } else if (classname == "QComboBox"_L1) {
        iface = new QAccessibleComboBox(widget);
#endif
#if QT_CONFIG(spinbox)
    } else if (classname == "QAbstractSpinBox"_L1) {
        iface = new QAccessibleAbstractSpinBox(widget);
    } else if (classname == "QSpinBox"_L1) {
        iface = new QAccessibleSpinBox(widget);
    } else if (classname == "QDoubleSpinBox"_L1) {
        iface = new QAccessibleDoubleSpinBox(widget);
#endif
#if QT_CONFIG(scrollbar)
    } else if (classname == "QScrollBar"_L1) {
        iface = new QAccessibleScrollBar(widget);
#endif
#if QT_CONFIG(slider)
    } else if (classname == "QAbstractSlider"_L1) {
        iface = new QAccessibleAbstractSlider(widget);
    } else if (classname == "QSlider"_L1) {
        iface = new QAccessibleSlider(widget);
#endif
#if QT_CONFIG(toolbutton)
    } else if (classname == "QToolButton"_L1) {
        iface = new QAccessibleToolButton(widget);
#endif // QT_CONFIG(toolbutton)
#if QT_CONFIG(abstractbutton)
    } else if (classname == "QCheckBox"_L1
            || classname == "QRadioButton"_L1
            || classname == "QPushButton"_L1
            || classname == "QAbstractButton"_L1) {
        iface = new QAccessibleButton(widget);
#endif
    } else if (classname == "QDialog"_L1) {
        iface = new QAccessibleWidget(widget, QAccessible::Dialog);
#if QT_CONFIG(messagebox)
    } else if (classname == "QMessageBox"_L1) {
        iface = new QAccessibleMessageBox(widget);
#endif
#if QT_CONFIG(mainwindow)
    } else if (classname == "QMainWindow"_L1) {
        iface = new QAccessibleMainWindow(widget);
#endif
    } else if (classname == "QLabel"_L1 || classname == "QLCDNumber"_L1) {
        iface = new QAccessibleDisplay(widget);
#if QT_CONFIG(groupbox)
    } else if (classname == "QGroupBox"_L1) {
        iface = new QAccessibleGroupBox(widget);
#endif
    } else if (classname == "QStatusBar"_L1) {
        iface = new QAccessibleDisplay(widget);
#if QT_CONFIG(progressbar)
    } else if (classname == "QProgressBar"_L1) {
        iface = new QAccessibleProgressBar(widget);
#endif
    } else if (classname == "QToolBar"_L1) {
        iface = new QAccessibleWidget(widget, QAccessible::ToolBar, widget->windowTitle());
#if QT_CONFIG(menubar)
    } else if (classname == "QMenuBar"_L1) {
        iface = new QAccessibleMenuBar(widget);
#endif
#if QT_CONFIG(menu)
    } else if (classname == "QMenu"_L1) {
        iface = new QAccessibleMenu(widget);
#endif
#if QT_CONFIG(treeview)
    } else if (classname == "QTreeView"_L1) {
        iface = new QAccessibleTree(widget);
#endif // QT_CONFIG(treeview)
#if QT_CONFIG(listview)
    } else if (classname == "QListView"_L1) {
        iface = new QAccessibleList(widget);
#endif
#if QT_CONFIG(itemviews)
    } else if (classname == "QTableView"_L1) {
        iface = new QAccessibleTable(widget);
#endif // QT_CONFIG(itemviews)
#if QT_CONFIG(tabbar)
    } else if (classname == "QTabBar"_L1) {
        iface = new QAccessibleTabBar(widget);
#endif
    } else if (classname == "QSizeGrip"_L1) {
        iface = new QAccessibleWidget(widget, QAccessible::Grip);
#if QT_CONFIG(splitter)
    } else if (classname == "QSplitter"_L1) {
        iface = new QAccessibleWidget(widget, QAccessible::Splitter);
    } else if (classname == "QSplitterHandle"_L1) {
        iface = new QAccessibleWidget(widget, QAccessible::Grip);
#endif
#if QT_CONFIG(textedit) && !defined(QT_NO_CURSOR)
    } else if (classname == "QTextEdit"_L1) {
        iface = new QAccessibleTextEdit(widget);
    } else if (classname == "QPlainTextEdit"_L1) {
        iface = new QAccessiblePlainTextEdit(widget);
#endif
    } else if (classname == "QTipLabel"_L1) {
        iface = new QAccessibleDisplay(widget, QAccessible::ToolTip);
    } else if (classname == "QFrame"_L1) {
        iface = new QAccessibleWidget(widget, QAccessible::Border);
#if QT_CONFIG(stackedwidget)
    } else if (classname == "QStackedWidget"_L1) {
        iface = new QAccessibleStackedWidget(widget);
#endif
#if QT_CONFIG(toolbox)
    } else if (classname == "QToolBox"_L1) {
        iface = new QAccessibleToolBox(widget);
#endif
#if QT_CONFIG(mdiarea)
    } else if (classname == "QMdiArea"_L1) {
        iface = new QAccessibleMdiArea(widget);
    } else if (classname == "QMdiSubWindow"_L1) {
        iface = new QAccessibleMdiSubWindow(widget);
#endif
#if QT_CONFIG(dialogbuttonbox)
    } else if (classname == "QDialogButtonBox"_L1) {
        iface = new QAccessibleDialogButtonBox(widget);
#endif
#if QT_CONFIG(dial)
    } else if (classname == "QDial"_L1) {
        iface = new QAccessibleDial(widget);
#endif
#if QT_CONFIG(rubberband)
    } else if (classname == "QRubberBand"_L1) {
        iface = new QAccessibleWidget(widget, QAccessible::Border);
#endif
#if QT_CONFIG(textbrowser) && !defined(QT_NO_CURSOR)
    } else if (classname == "QTextBrowser"_L1) {
        iface = new QAccessibleTextBrowser(widget);
#endif
#if QT_CONFIG(scrollarea)
    } else if (classname == "QAbstractScrollArea"_L1) {
        iface = new QAccessibleAbstractScrollArea(widget);
    } else if (classname == "QScrollArea"_L1) {
        iface = new QAccessibleScrollArea(widget);
#endif
#if QT_CONFIG(calendarwidget)
    } else if (classname == "QCalendarWidget"_L1) {
        iface = new QAccessibleCalendarWidget(widget);
#endif
#if QT_CONFIG(dockwidget)
    } else if (classname == "QDockWidget"_L1) {
        iface = new QAccessibleDockWidget(widget);
#endif

    } else if (classname == "QWidget"_L1) {
        iface = new QAccessibleWidget(widget);
    } else if (classname == "QWindowContainer"_L1) {
        iface = new QAccessibleWindowContainer(widget);
    }

    return iface;
}